

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_transaction_id.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::CurrentTransactionIdBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  MetaTransaction *pMVar1;
  element_type *peVar2;
  Value transaction_id;
  LogicalType LStack_c8;
  LogicalType local_b0;
  Value local_98;
  Value local_58;
  
  LogicalType::LogicalType(&local_b0,SQLNULL);
  Value::Value(&local_98,&local_b0);
  LogicalType::~LogicalType(&local_b0);
  if (bound_function[1].deserialize == (function_deserialize_t)0x0) {
    LogicalType::LogicalType(&LStack_c8,SQLNULL);
    Value::Value(&local_58,&LStack_c8);
    Value::operator=(&local_98,&local_58);
    Value::~Value(&local_58);
    LogicalType::~LogicalType(&LStack_c8);
  }
  else {
    pMVar1 = TransactionContext::ActiveTransaction
                       ((TransactionContext *)&bound_function[1].get_modified_databases);
    Value::UBIGINT(&local_58,pMVar1->global_transaction_id);
    Value::operator=(&local_98,&local_58);
    Value::~Value(&local_58);
  }
  peVar2 = (element_type *)operator_new(0x48);
  Value::Value(&local_58,&local_98);
  *(undefined ***)&(peVar2->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ =
       &PTR__CurrentTransactionIdData_02459488;
  Value::Value((Value *)((long)&(peVar2->super_enable_shared_from_this<duckdb::ClientContext>).
                                __weak_this_ + 8),&local_58);
  Value::~Value(&local_58);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  Value::~Value(&local_98);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
}

Assistant:

unique_ptr<FunctionData> CurrentTransactionIdBind(ClientContext &context, ScalarFunction &bound_function,
                                                  vector<unique_ptr<Expression>> &arguments) {
	Value transaction_id;
	if (context.transaction.HasActiveTransaction()) {
		transaction_id = Value::UBIGINT(context.transaction.ActiveTransaction().global_transaction_id);
	} else {
		transaction_id = Value();
	}
	return make_uniq<CurrentTransactionIdData>(transaction_id);
}